

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

bool __thiscall QIconModeViewBase::filterDragMoveEvent(QIconModeViewBase *this,QDragMoveEvent *e)

{
  QDragMoveEvent QVar1;
  QWidget *pQVar2;
  QSize QVar3;
  QAbstractItemModel *pQVar4;
  QListViewPrivate *this_00;
  bool bVar5;
  QListView *pQVar6;
  QPoint QVar7;
  QPoint QVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 local_a8 [16];
  QArrayDataPointer<QModelIndex> local_98;
  QPoint local_78;
  int local_70;
  int local_6c;
  QModelIndex local_68;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = e[0xc];
  e[0xc] = (QDragMoveEvent)0x0;
  pQVar6 = (QListView *)QDropEvent::source();
  if (pQVar6 == (this->super_QCommonListViewBase).qq) {
    bVar5 = QAbstractItemViewPrivate::canDrop
                      (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate,
                       (QDropEvent *)e);
    if (bVar5) {
      local_48 = itemsRect(this,&this->draggedItems);
      pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
               super_QAbstractScrollAreaPrivate.viewport;
      local_98.d = (Data *)draggedItemsDelta(this);
      local_68._0_16_ = QRect::translated(&local_48,(QPoint *)&local_98);
      QWidget::update(pQVar2,(QRect *)&local_68);
      local_68._0_16_ = *(undefined1 (*) [16])(e + 0x10);
      QVar7 = QPointF::toPoint((QPointF *)&local_68);
      this->draggedItemsPos = QVar7;
      pQVar2 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
               super_QAbstractScrollAreaPrivate.viewport;
      local_98.d = (Data *)draggedItemsDelta(this);
      local_68._0_16_ = QRect::translated(&local_48,(QPoint *)&local_98);
      QWidget::update(pQVar2,(QRect *)&local_68);
      local_68._0_16_ = ZEXT816(0xffffffffffffffff);
      local_68.m.ptr = (QAbstractItemModel *)0x0;
      if (((this->super_QCommonListViewBase).dd)->movement == Snap) {
        local_98.d = *(Data **)(e + 0x10);
        local_98.ptr = *(QModelIndex **)(e + 0x18);
        QVar7 = QPointF::toPoint((QPointF *)&local_98);
        QVar8 = QCommonListViewBase::offset(&this->super_QCommonListViewBase);
        local_a8._0_8_ =
             (ulong)(uint)(QVar8.xp.m_i.m_i + QVar7.xp.m_i.m_i) |
             ((ulong)QVar8 & 0xffffffff00000000) + (long)QVar7 & 0xffffffff00000000;
        local_78 = snapToGrid(this,(QPoint *)local_a8);
        QVar3 = ((this->super_QCommonListViewBase).dd)->grid;
        local_70 = local_78.xp.m_i.m_i + QVar3.wd.m_i.m_i + -1;
        local_6c = local_78.yp.m_i.m_i + QVar3.ht.m_i.m_i + -1;
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[7])(&local_98,this);
        if ((undefined1 *)local_98.size == (undefined1 *)0x0) {
          local_a8 = (undefined1  [16])0x0;
          local_68._0_8_ = 0xffffffffffffffff;
        }
        else {
          local_68.r = local_98.ptr[(long)(local_98.size + -1)].r;
          local_68.c = local_98.ptr[(long)(local_98.size + -1)].c;
          local_a8._0_8_ = local_98.ptr[(long)(local_98.size + -1)].i;
          local_a8._8_8_ = local_98.ptr[(long)(local_98.size + -1)].m;
        }
        local_68.i = local_a8._0_8_;
        local_68.m.ptr = (QAbstractItemModel *)local_a8._8_8_;
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
      }
      else {
        pQVar6 = (this->super_QCommonListViewBase).qq;
        local_98.d = *(Data **)(e + 0x10);
        local_98.ptr = *(QModelIndex **)(e + 0x18);
        local_78 = QPointF::toPoint((QPointF *)&local_98);
        (**(code **)(*(long *)&(pQVar6->super_QAbstractItemView).super_QAbstractScrollArea.
                               super_QFrame.super_QWidget + 0x1f0))(&local_68,pQVar6);
      }
      bVar5 = QListSpecialMethodsBase<QModelIndex>::contains<QModelIndex>
                        ((QListSpecialMethodsBase<QModelIndex> *)&this->draggedItems,&local_68);
      if (bVar5) {
LAB_00518f61:
        e[0xc] = (QDragMoveEvent)0x1;
      }
      else {
        pQVar4 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).model;
        uVar9 = (**(code **)(*(long *)pQVar4 + 0x138))(pQVar4,&local_68);
        if (((((uVar9 & 8) != 0) || (local_68.r < 0)) || (local_68.c < 0)) ||
           (local_68.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_00518f61;
      }
      this_00 = (this->super_QCommonListViewBase).dd;
      local_98.d = *(Data **)(e + 0x10);
      local_98.ptr = *(QModelIndex **)(e + 0x18);
      local_78 = QPointF::toPoint((QPointF *)&local_98);
      bVar5 = QAbstractItemViewPrivate::shouldAutoScroll
                        (&this_00->super_QAbstractItemViewPrivate,&local_78);
      if (bVar5) {
        QAbstractItemViewPrivate::startAutoScroll
                  (&((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate);
      }
      bVar5 = true;
      goto LAB_00518e99;
    }
  }
  (**(code **)(*(long *)e + 0x10))(e,QVar1);
  bVar5 = false;
LAB_00518e99:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterDragMoveEvent(QDragMoveEvent *e)
{
    const bool wasAccepted = e->isAccepted();

    // ignore by default
    e->ignore();

    if (e->source() != qq || !dd->canDrop(e)) {
        // restore previous acceptance on failure
        e->setAccepted(wasAccepted);
        return false;
    }

    // get old dragged items rect
    QRect itemsRect = this->itemsRect(draggedItems);
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // update position
    draggedItemsPos = e->position().toPoint();
    // get new items rect
    viewport()->update(itemsRect.translated(draggedItemsDelta()));
    // set the item under the cursor to current
    QModelIndex index;
    if (movement() == QListView::Snap) {
        QRect rect(snapToGrid(e->position().toPoint() + offset()), gridSize());
        const QList<QModelIndex> intersectVector = intersectingSet(rect);
        index = intersectVector.size() > 0 ? intersectVector.last() : QModelIndex();
    } else {
        index = qq->indexAt(e->position().toPoint());
    }
    // check if we allow drops here
    if (draggedItems.contains(index))
        e->accept(); // allow changing item position
    else if (dd->model->flags(index) & Qt::ItemIsDropEnabled)
        e->accept(); // allow dropping on dropenabled items
    else if (!index.isValid())
        e->accept(); // allow dropping in empty areas

    // the event was treated. do autoscrolling
    if (dd->shouldAutoScroll(e->position().toPoint()))
        dd->startAutoScroll();
    return true;
}